

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_direct_speakers.cpp
# Opt level: O1

optional<int> __thiscall
ear::GainCalculatorDirectSpeakersImpl::_findChannelWithinBounds
          (GainCalculatorDirectSpeakersImpl *this,SpeakerPosition *position,bool isLfe,double tol)

{
  double dVar1;
  int iVar2;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  pointer ppVar6;
  double *pdVar7;
  long lVar8;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  __i;
  ulong uVar9;
  pointer ppVar10;
  ulong uVar11;
  double dVar12;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> candidates;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_38;
  
  _findCandidates(&local_38,this,position,isLfe,tol);
  ppVar6 = local_38.
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)local_38.
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_38.
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = lVar8 >> 4;
  if (uVar9 == 0) {
    uVar9 = 0;
    uVar11 = 0;
  }
  else {
    if (uVar9 != 1) {
      if (local_38.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_38.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        lVar3 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<ear::GainCalculatorDirectSpeakersImpl::_findChannelWithinBounds(boost::variant<ear::PolarSpeakerPosition,ear::CartesianSpeakerPosition>const&,bool,double)::__0>>
                  (local_38.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_38.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar8 < 0x101) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<ear::GainCalculatorDirectSpeakersImpl::_findChannelWithinBounds(boost::variant<ear::PolarSpeakerPosition,ear::CartesianSpeakerPosition>const&,bool,double)::__0>>
                    (ppVar6,local_38.
                            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
        }
        else {
          ppVar10 = ppVar6 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<ear::GainCalculatorDirectSpeakersImpl::_findChannelWithinBounds(boost::variant<ear::PolarSpeakerPosition,ear::CartesianSpeakerPosition>const&,bool,double)::__0>>
                    (ppVar6,ppVar10);
          if (ppVar10 !=
              local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            pdVar7 = &ppVar6[0x10].second;
            do {
              iVar2 = ppVar10->first;
              dVar1 = ppVar10->second;
              dVar12 = ppVar10[-1].second;
              ppVar6 = ppVar10;
              pdVar4 = pdVar7;
              if (dVar1 < dVar12) {
                do {
                  pdVar5 = pdVar4;
                  ((pair<int,_double> *)(pdVar5 + -1))->first = *(int *)(pdVar5 + -3);
                  *pdVar5 = dVar12;
                  dVar12 = pdVar5[-4];
                  pdVar4 = pdVar5 + -2;
                } while (dVar1 < dVar12);
                ppVar6 = (pointer)(pdVar5 + -3);
              }
              ppVar6->first = iVar2;
              ppVar6->second = dVar1;
              ppVar10 = ppVar10 + 1;
              pdVar7 = pdVar7 + 2;
            } while (ppVar10 !=
                     local_38.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          }
        }
      }
      if (ABS((local_38.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->second -
              local_38.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start[1].second) <= tol) {
        uVar11 = 0;
        uVar9 = 0;
        goto LAB_0015f5c0;
      }
    }
    uVar11 = (ulong)(uint)(local_38.
                           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->first << 0x20;
    uVar9 = 1;
  }
LAB_0015f5c0:
  if (local_38.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (optional<int>)(type)(uVar11 | uVar9);
}

Assistant:

boost::optional<int>
  GainCalculatorDirectSpeakersImpl::_findChannelWithinBounds(
      const SpeakerPosition& position, bool isLfe, double tol) {
    std::vector<std::pair<int, double>> candidates =
        _findCandidates(position, isLfe, tol);
    if (candidates.size() == 0) {
      return boost::none;
    } else if (candidates.size() == 1) {
      return candidates[0].first;
    } else {
      std::sort(candidates.begin(), candidates.end(),
                [](const std::pair<int, double>& a,
                   const std::pair<int, double>& b) -> bool {
                  return a.second < b.second;
                });
      if (std::abs(candidates[0].second - candidates[1].second) > tol) {
        return candidates[0].first;
      }
    }
    return boost::none;
  }